

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O1

bool XYZ2NEU(XYZ station,XYZ obj,ELLIPSOID type,XYZ *neu)

{
  double dVar1;
  double dVar2;
  double __x;
  double __x_00;
  double *pdVar3;
  Matrix<double,_3,_3> *this;
  Vector3d result;
  Vector3d vec;
  Matrix3d rotation;
  BLH station_blh;
  double local_88;
  Matrix<double,_3,_1> local_68;
  Matrix<double,_3,_1> local_58;
  Matrix<double,_3,_3> local_48;
  BLH local_38;
  
  local_38.B = 0.0;
  local_38.L = 0.0;
  local_38.H = 0.0;
  XYZ2BLH(station,type,&local_38);
  __x = (local_38.B * 3600.0) / 206264.80624709636;
  __x_00 = (local_38.L * 3600.0) / 206264.80624709636;
  this = &local_48;
  Matrix<double,_3,_3>::Matrix(this);
  local_88 = sin(__x);
  local_88 = -local_88;
  dVar1 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,0);
  *pdVar3 = dVar1 * local_88;
  local_88 = sin(__x);
  local_88 = -local_88;
  dVar1 = sin(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,1);
  *pdVar3 = dVar1 * local_88;
  dVar1 = cos(__x);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,0,2);
  *pdVar3 = dVar1;
  local_88 = sin(__x_00);
  local_88 = -local_88;
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,0);
  *pdVar3 = local_88;
  dVar1 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(this,1,2);
  *pdVar3 = 0.0;
  dVar1 = cos(__x);
  dVar2 = cos(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,0);
  *pdVar3 = dVar2 * dVar1;
  dVar1 = cos(__x);
  dVar2 = sin(__x_00);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,1);
  *pdVar3 = dVar2 * dVar1;
  dVar1 = sin(__x);
  pdVar3 = Matrix<double,_3,_3>::operator()(this,2,2);
  *pdVar3 = dVar1;
  Matrix<double,_3,_1>::Matrix(&local_58);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_58,0,0);
  *pdVar3 = obj.X - station.X;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_58,1,0);
  *pdVar3 = obj.Y - station.Y;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_58,2,0);
  *pdVar3 = obj.Z - station.Z;
  local_68 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)this,&local_58);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_68,0,0);
  neu->X = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_68,1,0);
  neu->Y = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_68,2,0);
  neu->Z = *pdVar3;
  Matrix<double,_3,_1>::deleteMatrix(&local_58);
  Matrix<double,_3,_1>::deleteMatrix(&local_68);
  Matrix<double,_3,_3>::deleteMatrix(this);
  this->data = (double *)0x0;
  this->rows = 3;
  this->cols = -2;
  this->cols = 3;
  pdVar3 = (double *)operator_new__(0x48);
  this->data = pdVar3;
  return SUB81(pdVar3,0);
}

Assistant:

bool XYZ2NEU(const XYZ station, const XYZ obj, ELLIPSOID type, XYZ &neu)
{
    BLH station_blh;

    XYZ2BLH(station, type, station_blh);
    // cout << station_blh << endl;
    double B = Deg2Rad(station_blh.B);
    double L = Deg2Rad(station_blh.L);
    Matrix3d rotation;
    rotation(0, 0) = -sin(B) * cos(L);
    rotation(0, 1) = -sin(B) * sin(L);
    rotation(0, 2) = cos(B);

    rotation(1, 0) = -sin(L);
    rotation(1, 1) = cos(L);
    rotation(1, 2) = 0;

    rotation(2, 0) = cos(B) * cos(L);
    rotation(2, 1) = cos(B) * sin(L);
    rotation(2, 2) = sin(B);

    Vector3d vec;
    vec(0, 0) = obj.X - station.X;
    vec(1, 0) = obj.Y - station.Y;
    vec(2, 0) = obj.Z - station.Z;

    Vector3d result = rotation * vec;
    neu.X = result(0, 0);
    neu.Y = result(1, 0);
    neu.Z = result(2, 0);
    vec.deleteMatrix();
    result.deleteMatrix();
    rotation.deleteMatrix();
}